

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

bool __thiscall
bloaty::ArgParser::TryParseUint64Option(ArgParser *this,string_view flag,uint64_t *val)

{
  int iVar1;
  long *__nptr;
  bool bVar2;
  int *piVar3;
  ulonglong uVar4;
  undefined8 uVar5;
  Arg *in_R9;
  string_view format;
  string_view val_str;
  string_view local_c8;
  char *local_b8;
  long *local_b0;
  char *local_a8;
  long local_a0 [4];
  string local_80;
  Arg local_60;
  
  local_c8._M_len = 0;
  local_c8._M_str = (char *)0x0;
  bVar2 = TryParseOption(this,flag,&local_c8);
  if (!bVar2) {
    return bVar2;
  }
  local_b0 = local_a0;
  local_b8 = flag._M_str;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,local_c8._M_str,local_c8._M_str + local_c8._M_len);
  __nptr = local_b0;
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  uVar4 = strtoull((char *)__nptr,(char **)&local_60,0);
  if ((long *)local_60.piece_._M_len == __nptr) {
    uVar5 = std::__throw_invalid_argument("stoull");
    __cxa_begin_catch(uVar5);
    local_a8 = local_b8;
    local_60.piece_._M_len = local_c8._M_len;
    local_60.piece_._M_str = local_c8._M_str;
    format._M_str = (char *)&local_b0;
    format._M_len = (size_t)"option \'$0\' had non-integral argument: $1";
    local_b0 = (long *)flag._M_len;
    absl::Substitute_abi_cxx11_(&local_80,(absl *)0x29,format,&local_60,in_R9);
    Throw(local_80._M_dataplus._M_p,0x836);
  }
  if (*piVar3 != 0) {
    if (*piVar3 != 0x22) goto LAB_00189a9a;
    uVar4 = std::__throw_out_of_range("stoull");
  }
  *piVar3 = iVar1;
LAB_00189a9a:
  *val = uVar4;
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  return bVar2;
}

Assistant:

bool TryParseUint64Option(string_view flag, uint64_t* val) {
    string_view val_str;
    if (!TryParseOption(flag, &val_str)) {
      return false;
    }

    try {
      *val = std::stoull(std::string(val_str), nullptr, 0);
    } catch (...) {
      THROWF("option '$0' had non-integral argument: $1", flag, val_str);
    }

    return true;
  }